

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputGetPutOptions(Node *this,Node *Channel,ostream *os)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  int InputFlag;
  undefined1 local_290 [32];
  undefined1 local_270 [32];
  undefined1 local_250 [32];
  undefined1 local_230 [32];
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 local_70 [48];
  undefined1 local_40 [40];
  ostream *os_local;
  Node *Channel_local;
  Node *this_local;
  
  iVar1 = this->Type;
  local_40._32_8_ = os;
  os_local = (ostream *)Channel;
  Channel_local = this;
  if (iVar1 != 0x10b) {
    InputFlag = (int)Channel;
    if (iVar1 == 0x121) {
      GetIPChannel_abi_cxx11_((Node *)local_230,InputFlag);
      poVar3 = std::operator<<(os,(string *)local_230);
      poVar3 = std::operator<<(poVar3,".SetCount(");
      Expression_abi_cxx11_((Node *)local_250);
      poVar3 = std::operator<<(poVar3,(string *)local_250);
      poVar3 = std::operator<<(poVar3,");");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::string::~string((string *)local_230);
      return;
    }
    if (iVar1 == 0x159) {
      Indent_abi_cxx11_((Node *)local_f0);
      poVar3 = std::operator<<(os,(string *)local_f0);
      GetIPChannel_abi_cxx11_((Node *)local_110,(int)os_local);
      poVar3 = std::operator<<(poVar3,(string *)local_110);
      poVar3 = std::operator<<(poVar3,".SetKey(");
      Expression_abi_cxx11_((Node *)local_130);
      poVar3 = std::operator<<(poVar3,(string *)local_130);
      poVar3 = std::operator<<(poVar3,");");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)local_f0);
      uVar2 = local_40._32_8_;
      if (this->Tree[1] == (Node *)0x0) {
        return;
      }
      Indent_abi_cxx11_((Node *)local_150);
      poVar3 = std::operator<<((ostream *)uVar2,(string *)local_150);
      GetIPChannel_abi_cxx11_((Node *)local_170,(int)os_local);
      poVar3 = std::operator<<(poVar3,(string *)local_170);
      std::operator<<(poVar3,".SetKeyMode(");
      std::__cxx11::string::~string((string *)local_170);
      std::__cxx11::string::~string((string *)local_150);
      iVar1 = this->Tree[1]->Type;
      if (iVar1 == 0x130) {
        std::operator<<((ostream *)local_40._32_8_,"Equal");
      }
      else if (iVar1 == 0x147) {
        std::operator<<((ostream *)local_40._32_8_,"GreaterEqual");
      }
      else if (iVar1 == 0x14d) {
        std::operator<<((ostream *)local_40._32_8_,"Greater");
      }
      poVar3 = std::operator<<((ostream *)local_40._32_8_,");");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Indent_abi_cxx11_((Node *)local_190);
      poVar3 = std::operator<<(poVar3,(string *)local_190);
      GetIPChannel_abi_cxx11_((Node *)local_1b0,(int)os_local);
      poVar3 = std::operator<<(poVar3,(string *)local_1b0);
      poVar3 = std::operator<<(poVar3,".SetKeyValue(");
      Expression_abi_cxx11_((Node *)local_1d0);
      poVar3 = std::operator<<(poVar3,(string *)local_1d0);
      poVar3 = std::operator<<(poVar3,");");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_1d0);
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)local_190);
      return;
    }
    if (iVar1 != 0x183) {
      if (iVar1 == 0x187) {
        Indent_abi_cxx11_((Node *)local_b0);
        poVar3 = std::operator<<(os,(string *)local_b0);
        GetIPChannel_abi_cxx11_((Node *)local_d0,(int)os_local);
        poVar3 = std::operator<<(poVar3,(string *)local_d0);
        poVar3 = std::operator<<(poVar3,".SetRegardless();");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_d0);
        std::__cxx11::string::~string((string *)local_b0);
        return;
      }
      if (iVar1 == 0x191) {
        GetIPChannel_abi_cxx11_((Node *)local_1f0,InputFlag);
        poVar3 = std::operator<<(os,(string *)local_1f0);
        poVar3 = std::operator<<(poVar3,".SetRfaValue(");
        Expression_abi_cxx11_((Node *)local_210);
        poVar3 = std::operator<<(poVar3,(string *)local_210);
        poVar3 = std::operator<<(poVar3,");");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_210);
        std::__cxx11::string::~string((string *)local_1f0);
        return;
      }
      if (iVar1 != 0x1d5) {
        if (iVar1 != 0x1f5) {
          GetIPChannel_abi_cxx11_((Node *)local_270,InputFlag);
          poVar3 = std::operator<<(os,(string *)local_270);
          poVar3 = std::operator<<(poVar3,".Goofy(");
          Expression_abi_cxx11_((Node *)local_290);
          poVar3 = std::operator<<(poVar3,(string *)local_290);
          poVar3 = std::operator<<(poVar3,");");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_290);
          std::__cxx11::string::~string((string *)local_270);
          return;
        }
        if (this->Tree[0] != (Node *)0x0) {
          OutputGetPutOptions(this->Tree[0],Channel,os);
        }
        if (this->Tree[1] == (Node *)0x0) {
          return;
        }
        OutputGetPutOptions(this->Tree[1],(Node *)os_local,(ostream *)local_40._32_8_);
        return;
      }
    }
  }
  Indent_abi_cxx11_((Node *)local_40);
  poVar3 = std::operator<<(os,(string *)local_40);
  GetIPChannel_abi_cxx11_((Node *)local_70,(int)os_local);
  poVar3 = std::operator<<(poVar3,(string *)local_70);
  poVar3 = std::operator<<(poVar3,".SetRecord(");
  Expression_abi_cxx11_((Node *)local_90);
  poVar3 = std::operator<<(poVar3,(string *)local_90);
  poVar3 = std::operator<<(poVar3,");");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Node::OutputGetPutOptions(
	Node* Channel,		/**< BASIC channel */
	std::ostream& os	/**< iostream to write C++ code to */
)
{
	switch(Type)
	{
	case BAS_N_LIST:
		if (Tree[0] != 0)
		{
			Tree[0]->OutputGetPutOptions(Channel, os);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->OutputGetPutOptions(Channel, os);
		}
		break;

	case BAS_V_RMSRECORD:
	case BAS_S_RECORD:
	case BAS_S_BLOCK:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRecord(" <<
			Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_REGARDLESS:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetRegardless();" << std::endl;
		break;

	case BAS_S_KEY:
		os << Indent() <<
			GetIPChannel(Channel, 0) <<
			".SetKey(" << Tree[0]->Expression() << ");" <<
			std::endl;
		if (Tree[1] != 0)
		{
			os << Indent() <<
				GetIPChannel(Channel, 0) <<
				".SetKeyMode(";
			switch(Tree[1]->Type)
			{
			case BAS_S_EQ:
				os << "Equal";
				break;
			case BAS_S_GE:
				os << "GreaterEqual";
				break;
			case BAS_S_GT:
				os << "Greater";
				break;

			}
			os << ");" << std::endl <<
				Indent() <<
				GetIPChannel(Channel, 0) <<
				".SetKeyValue(" << Tree[2]->Expression() << ");" << std::endl;
		}
		break;

	case BAS_S_RFA:
		os <<
			GetIPChannel(Channel, 0) <<
			".SetRfaValue(" <<
			Tree[0]->Expression() << ");" << std::endl;
		break;

	case BAS_S_COUNT:
		os <<
			GetIPChannel(Channel, 0) <<
			".SetCount(" << Tree[0]->Expression() << ");" <<
			std::endl;
		break;
	default:
		os <<
			GetIPChannel(Channel, 0) <<
			".Goofy(" << Expression() << ");" << std::endl;
	}
}